

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O3

ion_err_t dictionary_close(ion_dictionary_t *dictionary)

{
  uint uVar1;
  ion_key_type_t iVar2;
  uint uVar3;
  ion_dictionary_parent_t *piVar4;
  code *pcVar5;
  ion_dictionary_compare_t p_Var6;
  _func_ion_err_t_ion_dictionary_t_ptr *p_Var7;
  ion_key_t pvVar8;
  ion_value_t pvVar9;
  ion_err_t iVar10;
  byte bVar11;
  char cVar12;
  ion_key_t pvVar13;
  ion_status_t iVar14;
  ion_key_size_t extraout_EDX;
  ion_dictionary_handler_t *piVar15;
  long alStack_f0 [3];
  undefined1 auStack_d8 [16];
  ion_predicate_t predicate;
  ion_dictionary_handler_t fallback_handler;
  ion_dictionary_t fallback_dict;
  ion_record_t record;
  ion_dict_cursor_t *cursor;
  
  if (dictionary->status != '\x01') {
    alStack_f0[2] = 0x104a29;
    iVar10 = (*dictionary->handler->close_dictionary)(dictionary);
    if (iVar10 != '\0') {
      if (iVar10 != '\x0f') {
        return iVar10;
      }
      record.value = (ion_value_t)0x0;
      alStack_f0[2] = 0x104a61;
      dictionary_build_predicate((ion_predicate_t *)(auStack_d8 + 8),'\x02');
      alStack_f0[2] = 0x104a71;
      iVar10 = (*dictionary->handler->find)
                         (dictionary,(ion_predicate_t *)(auStack_d8 + 8),
                          (ion_dict_cursor_t **)&record.value);
      if (iVar10 != '\0') {
        return iVar10;
      }
      piVar4 = dictionary->instance;
      uVar1 = (piVar4->record).key_size;
      iVar2 = piVar4->key_type;
      fallback_dict.handler =
           (ion_dictionary_handler_t *)
           (auStack_d8 + -((long)(int)uVar1 + 0xfU & 0xfffffffffffffff0));
      pvVar13 = (ion_key_t)
                ((long)fallback_dict.handler -
                ((long)(piVar4->record).value_size + 0xfU & 0xfffffffffffffff0));
      record.key = pvVar13;
      *(undefined8 *)((long)pvVar13 + -8) = 0x104ac4;
      ffdict_init((ion_dictionary_handler_t *)&predicate.destroy);
      uVar3 = dictionary->instance->id;
      *(_func_ion_err_t_ion_dictionary_t_ptr ***)((long)pvVar13 + -8) =
           &fallback_handler.close_dictionary;
      *(_func_void_ion_predicate_t_ptr_ptr ***)((long)pvVar13 + -0x10) = &predicate.destroy;
      *(undefined8 *)((long)pvVar13 + -0x18) = 0x104b11;
      iVar14 = (*fallback_handler.insert)
                         ((ion_dictionary_t *)(ulong)uVar3,(ion_key_t)(ulong)iVar2,
                          (ion_value_t)(ulong)uVar1);
      if (iVar14.error != '\0') {
        return iVar14.error;
      }
      *(uint *)(fallback_dict._0_8_ + 0x18) = uVar3;
      fallback_handler.close_dictionary._0_1_ = 0;
      while( true ) {
        pvVar9 = record.value;
        pcVar5 = *(code **)((long)record.value + 0x18);
        *(undefined8 *)((long)pvVar13 + -8) = 0x104b3f;
        bVar11 = (*pcVar5)(pvVar9,&fallback_dict.handler);
        pvVar8 = record.key;
        piVar15 = fallback_dict.handler;
        if ((bVar11 != 4) && (bVar11 != 2)) break;
        pcVar5 = *(code **)fallback_dict.instance;
        *(undefined8 *)((long)pvVar13 + -8) = 0x104b5c;
        cVar12 = (*pcVar5)(&fallback_handler.close_dictionary,piVar15,pvVar8);
        if (cVar12 != '\0') {
          pcVar5 = *(code **)((long)record.value + 0x20);
          *(undefined8 *)((long)pvVar13 + -8) = 0x104b6e;
          (*pcVar5)();
          p_Var6 = fallback_dict.instance[1].compare;
          *(undefined8 *)((long)pvVar13 + -8) = 0x104b79;
          (*p_Var6)(&fallback_handler.close_dictionary,piVar15,extraout_EDX);
          return cVar12;
        }
      }
      if ((bVar11 & 0xfd) != 1) {
        return '\x12';
      }
      pcVar5 = *(code **)((long)record.value + 0x20);
      *(undefined8 *)((long)pvVar13 + -8) = 0x104b8e;
      (*pcVar5)();
      *(undefined8 *)((long)pvVar13 + -8) = 0x104b97;
      iVar10 = dictionary_close((ion_dictionary_t *)&fallback_handler.close_dictionary);
      if (iVar10 != '\0') {
        return iVar10;
      }
      p_Var7 = dictionary->handler->delete_dictionary;
      *(undefined8 *)((long)pvVar13 + -8) = 0x104ba9;
      iVar10 = (*p_Var7)(dictionary);
      if (iVar10 != '\0') {
        return iVar10;
      }
    }
    dictionary->status = '\x01';
  }
  return '\0';
}

Assistant:

ion_err_t
dictionary_close(
	ion_dictionary_t *dictionary
) {
	if (ion_dictionary_status_closed == dictionary->status) {
		return err_ok;
	}

	ion_err_t error = dictionary->handler->close_dictionary(dictionary);

	if (err_not_implemented == error) {
		ion_predicate_t		predicate;
		ion_dict_cursor_t	*cursor = NULL;
		ion_record_t		record;
		ion_err_t			err;

		dictionary_build_predicate(&predicate, predicate_all_records);
		err = dictionary_find(dictionary, &predicate, &cursor);

		if (err_ok != err) {
			return err;
		}

		int				key_size	= dictionary->instance->record.key_size;
		int				value_size	= dictionary->instance->record.value_size;
		ion_key_type_t	key_type	= dictionary->instance->key_type;

		record.key		= alloca(key_size);
		record.value	= alloca(value_size);

		ion_dictionary_handler_t	fallback_handler;
		ion_dictionary_t			fallback_dict;

		ffdict_init(&fallback_handler);

		err = dictionary_create(&fallback_handler, &fallback_dict, dictionary->instance->id, key_type, key_size, value_size, 1);

		if (err_ok != err) {
			return err;
		}

		ion_cursor_status_t cursor_status;

		while (cs_cursor_active == (cursor_status = cursor->next(cursor, &record)) || cs_cursor_initialized == cursor_status) {
			ion_status_t status = dictionary_insert(&fallback_dict, record.key, record.value);

			if (err_ok != status.error) {
				cursor->destroy(&cursor);
				dictionary_delete_dictionary(&fallback_dict);
				return status.error;
			}
		}

		/* Cursor has either reached the end of the result set or there was no
		   result set to traverse, and the cursor remains uninitialized. */
		if ((cs_end_of_results != cursor_status) && (cs_cursor_uninitialized != cursor_status)) {
			return err_uninitialized;
		}

		cursor->destroy(&cursor);

		err = dictionary_close(&fallback_dict);

		if (err_ok != err) {
			return err;
		}

		err = dictionary_delete_dictionary(dictionary);

		if (err_ok != err) {
			return err;
		}

		error = err_ok;
	}

	if (err_ok == error) {
		dictionary->status = ion_dictionary_status_closed;
	}

	return error;
}